

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O2

int jpc_ppxstab_insert(jpc_ppxstab_t *tab,jpc_ppxstabent_t *ent)

{
  uint uVar1;
  jpc_ppxstabent_t **ppjVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  size_t num_elements;
  
  uVar1 = tab->numents;
  uVar3 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  do {
    if (uVar6 == uVar3) {
LAB_0011e18e:
      if (tab->maxents <= (int)uVar1) {
        num_elements = (long)tab->maxents + 0x80;
        if (tab->ents == (jpc_ppxstabent_t **)0x0) {
          ppjVar2 = (jpc_ppxstabent_t **)jas_alloc2(num_elements,8);
        }
        else {
          ppjVar2 = (jpc_ppxstabent_t **)jas_realloc2(tab->ents,num_elements,8);
        }
        if (ppjVar2 == (jpc_ppxstabent_t **)0x0) {
          return -1;
        }
        tab->ents = ppjVar2;
        tab->maxents = (int)num_elements;
        uVar1 = tab->numents;
      }
      lVar5 = (long)(int)uVar1;
      lVar4 = lVar5 << 0x20;
      for (; ppjVar2 = tab->ents, (int)uVar6 < lVar5; lVar5 = lVar5 + -1) {
        ppjVar2[lVar5] = ppjVar2[lVar5 + -1];
        lVar4 = lVar4 + -0x100000000;
      }
      *(jpc_ppxstabent_t **)((long)ppjVar2 + (lVar4 >> 0x1d)) = ent;
      tab->numents = uVar1 + 1;
      return 0;
    }
    if (ent->ind < tab->ents[uVar3]->ind) {
      uVar6 = uVar3 & 0xffffffff;
      goto LAB_0011e18e;
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static int jpc_ppxstab_insert(jpc_ppxstab_t *tab, jpc_ppxstabent_t *ent)
{
	int inspt;
	int i;

	for (i = 0; i < tab->numents; ++i) {
		if (tab->ents[i]->ind > ent->ind) {
			break;
		}
	}
	inspt = i;

	if (tab->numents >= tab->maxents) {
		if (jpc_ppxstab_grow(tab, tab->maxents + 128)) {
			return -1;
		}
	}

	for (i = tab->numents; i > inspt; --i) {
		tab->ents[i] = tab->ents[i - 1];
	}
	tab->ents[i] = ent;
	++tab->numents;

	return 0;
}